

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_compatibleUnitsInDifferentModelsChildNotFound_Test::TestBody
          (Units_compatibleUnitsInDifferentModelsChildNotFound_Test *this)

{
  char *pcVar1;
  double local_90;
  AssertionResult gtest_ar;
  double local_68;
  UnitsPtr u2;
  UnitsPtr u1;
  ModelPtr m2;
  UnitsPtr u3;
  ModelPtr m1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"nurseryrhymes",(allocator<char> *)&m2);
  libcellml::Model::create((string *)&m1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"farmwork",(allocator<char> *)&u1);
  libcellml::Model::create((string *)&m2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"bo_peep",(allocator<char> *)&u2);
  libcellml::Units::create((string *)&u1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"sheep",(allocator<char> *)&u2);
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"flock",(allocator<char> *)&u3);
  libcellml::Units::create((string *)&u2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"sheep",(allocator<char> *)&local_90);
  libcellml::Units::create((string *)&u3);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"sheep",(allocator<char> *)&local_90);
  libcellml::Units::addUnit
            ((string *)u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Model::addUnits
            ((shared_ptr *)
             m1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             m2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             m2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_90 = 0.0;
  local_68 = (double)libcellml::Units::scalingFactor((shared_ptr *)&u1,(shared_ptr *)&u2,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0","libcellml::Units::scalingFactor(u1, u2)",&local_90,
             &local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x970,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, compatibleUnitsInDifferentModelsChildNotFound)
{
    auto m1 = libcellml::Model::create("nurseryrhymes");
    auto m2 = libcellml::Model::create("farmwork");
    auto u1 = libcellml::Units::create("bo_peep");
    u1->addUnit("sheep");

    auto u2 = libcellml::Units::create("flock");
    auto u3 = libcellml::Units::create("sheep");
    u2->addUnit("sheep");

    m1->addUnits(u1);
    m2->addUnits(u2);
    m2->addUnits(u3);

    // Child unit of "sheep" exists only in m2, return 0.0.
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
}